

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O1

void irr::video::CColorConverter::convert_A8R8G8B8toB8G8R8(void *sP,s32 sN,void *dP)

{
  long lVar1;
  u8 *dB;
  u8 *sB;
  
  if (0 < sN) {
    lVar1 = 0;
    do {
      *(undefined1 *)dP = *(undefined1 *)((long)sP + lVar1 * 4);
      *(undefined1 *)((long)dP + 1) = *(undefined1 *)((long)sP + lVar1 * 4 + 1);
      *(undefined1 *)((long)dP + 2) = *(undefined1 *)((long)sP + lVar1 * 4 + 2);
      lVar1 = lVar1 + 1;
      dP = (void *)((long)dP + 3);
    } while (sN != (int)lVar1);
  }
  return;
}

Assistant:

void CColorConverter::convert_A8R8G8B8toB8G8R8(const void *sP, s32 sN, void *dP)
{
	u8 *sB = (u8 *)sP;
	u8 *dB = (u8 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		// sB[3] is alpha
		dB[0] = sB[0];
		dB[1] = sB[1];
		dB[2] = sB[2];

		sB += 4;
		dB += 3;
	}
}